

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O0

bool QInternalMimeData::hasFormatHelper(QString *mimeType,QMimeData *data)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  qsizetype qVar4;
  const_reference pQVar5;
  ulong uVar6;
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar7;
  int i;
  bool foundFormat;
  QStringList imageFormats;
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  QLatin1StringView *in_stack_ffffffffffffff60;
  QListSpecialMethods<QString> *in_stack_ffffffffffffff68;
  long *plVar8;
  int local_68;
  bool local_61;
  bool local_49;
  QList<QString> local_30;
  QLatin1StringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = (**(code **)(*in_RSI + 0x60))(in_RSI,in_RDI);
  local_61 = (bool)(bVar1 & 1);
  if (local_61 == false) {
    local_18 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
    bVar2 = ::operator==((QString *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (bVar2) {
      local_30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_30.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      imageWriteMimeFormats();
      for (local_68 = 0; qVar4 = QList<QString>::size(&local_30), local_68 < qVar4;
          local_68 = local_68 + 1) {
        plVar8 = in_RSI;
        pQVar5 = QList<QString>::at((QList<QString> *)in_stack_ffffffffffffff60,
                                    CONCAT17(in_stack_ffffffffffffff5f,
                                             CONCAT16(in_stack_ffffffffffffff5e,
                                                      CONCAT24(in_stack_ffffffffffffff5c,
                                                               in_stack_ffffffffffffff58))));
        bVar1 = (**(code **)(*plVar8 + 0x60))(plVar8,pQVar5);
        local_61 = (bool)(bVar1 & 1);
        if ((bVar1 & 1) != 0) break;
      }
      QList<QString>::~QList((QList<QString> *)0x3a7dbb);
    }
    else {
      QVar7 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_ffffffffffffff68,(size_t)in_RDI);
      uVar6 = QString::startsWith((QLatin1String *)in_RDI,(CaseSensitivity)QVar7.m_size);
      if ((uVar6 & 1) != 0) {
        uVar3 = QMimeData::hasImage();
        local_49 = false;
        if ((uVar3 & 1) != 0) {
          imageWriteMimeFormats();
          local_49 = QListSpecialMethods<QString>::contains
                               (in_stack_ffffffffffffff68,in_RDI,
                                CONCAT13(local_49,CONCAT12(in_stack_ffffffffffffff5e,
                                                           in_stack_ffffffffffffff5c)));
          QList<QString>::~QList((QList<QString> *)0x3a7e66);
        }
        goto LAB_003a7e76;
      }
    }
  }
  local_49 = local_61;
LAB_003a7e76:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QInternalMimeData::hasFormatHelper(const QString &mimeType, const QMimeData *data)
{

    bool foundFormat = data->hasFormat(mimeType);
    if (!foundFormat) {
        if (mimeType == "application/x-qt-image"_L1) {
            // check all supported image formats
            QStringList imageFormats = imageWriteMimeFormats();
            for (int i = 0; i < imageFormats.size(); ++i) {
                if ((foundFormat = data->hasFormat(imageFormats.at(i))))
                    break;
            }
        } else if (mimeType.startsWith("image/"_L1)) {
            return data->hasImage() && imageWriteMimeFormats().contains(mimeType);
        }
    }
    return foundFormat;
}